

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O0

mcmcx1def *
mcmini(ulong max,uint pages,ulong swapsize,osfildef *swapfp,char *swapfilename,errcxdef *errctx)

{
  mcmodef *pmVar1;
  mcmhdef *pmVar2;
  size_t sVar3;
  uchar *puVar4;
  ushort in_SI;
  ulong in_RDI;
  errcxdef *in_R9;
  errdef fr_;
  int err;
  ushort rem;
  ushort siz;
  mcmodef *obj;
  uchar *chunk;
  mcmcx1def *ctx;
  ushort uVar5;
  char *in_stack_fffffffffffffe68;
  errcxdef *in_stack_fffffffffffffe70;
  errdef *in_stack_fffffffffffffe78;
  errcxdef *errctx_00;
  int in_stack_fffffffffffffe80;
  uint in_stack_fffffffffffffe84;
  osfildef *in_stack_fffffffffffffe88;
  erradef in_stack_fffffffffffffe90;
  erradef in_stack_fffffffffffffe98;
  erradef in_stack_fffffffffffffea0;
  __jmp_buf_tag _Stack_118;
  int local_50;
  ushort local_4c;
  ushort local_4a;
  mcmodef *local_48;
  mcmcx1def *local_40;
  mcmcx1def *local_38;
  errcxdef *local_30;
  ushort local_c;
  ulong local_8;
  
  local_8 = in_RDI;
  if (in_RDI < 0x8000) {
    local_8 = 0x8000;
  }
  local_4c = -0x8000;
  local_30 = in_R9;
  local_c = in_SI;
  local_40 = (mcmcx1def *)
             mchalo((errcxdef *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                    (size_t)in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
  local_38 = local_40;
  local_50 = _setjmp(&_Stack_118);
  if (local_50 == 0) {
    errctx_00 = (errcxdef *)local_30->errcxptr;
    local_30->errcxptr = (errdef *)&stack0xfffffffffffffe78;
    mcsini((mcscxdef *)in_stack_fffffffffffffea0.errastr,
           (mcmcx1def *)in_stack_fffffffffffffe98.errastr,(ulong)in_stack_fffffffffffffe90,
           in_stack_fffffffffffffe88,(char *)((ulong)in_stack_fffffffffffffe84 << 0x20),errctx_00);
    local_30->errcxptr = (errdef *)errctx_00;
    local_40 = local_40 + 1;
    local_4c = local_4c + -0x80;
    local_38->mcmcxtab = (mcmodef **)local_40;
    local_4a = local_c << 3;
    memset(local_38->mcmcxtab,0,(ulong)local_4a);
    pmVar2 = (mcmhdef *)((long)&local_40->mcmcxtab + (long)(int)(uint)local_4a);
    local_38->mcmcxhpch = pmVar2;
    local_40 = (mcmcx1def *)(pmVar2 + 1);
    local_4c = (local_4c - local_4a) + -8;
    local_38->mcmcxhpch->mcmhnxt = (mcmhdef *)0x0;
    *(undefined2 *)&((mcmhdef *)local_40)->mcmhnxt = 0;
    sVar3 = osrndsz(2);
    local_40 = (mcmcx1def *)((long)&local_40->mcmcxtab + sVar3);
    sVar3 = osrndsz(2);
    local_4c = local_4c - (short)sVar3;
    *local_38->mcmcxtab = (mcmodef *)local_40;
    memset(*local_38->mcmcxtab,0,0x2000);
    local_40 = (mcmcx1def *)((long)local_40 + 0x2000);
    local_4c = local_4c + -0x2000;
    pmVar1 = *local_38->mcmcxtab;
    pmVar1->mcmoflg = 0x6a;
    pmVar1->mcmoptr = (uchar *)*local_38->mcmcxtab;
    pmVar1->mcmosiz = 0x2000;
    local_38->mcmcxmru = 0xffff;
    local_38->mcmcxlru = 0xffff;
    local_38->mcmcxmax = local_8 - 0x8000;
    local_38->mcmcxpage = 1;
    local_38->mcmcxpgmx = local_c;
    local_38->mcmcxerr = local_30;
    local_38->mcmcxcsw = mcmcswf;
    local_38->mcmcxfre = 1;
    local_48 = local_38->mcmcxtab[(int)(uint)local_38->mcmcxfre >> 8] +
               (int)(local_38->mcmcxfre & 0xff);
    local_48->mcmoprv = 0xffff;
    local_48->mcmonxt = 0xffff;
    local_48->mcmoflg = 0x80;
    *(mcmon *)&((mcmodef *)local_40)->mcmoptr = local_38->mcmcxfre;
    sVar3 = osrndsz(2);
    local_40 = (mcmcx1def *)((long)&local_40->mcmcxtab + sVar3);
    sVar3 = osrndsz(2);
    local_4c = local_4c - (short)sVar3;
    local_48->mcmoptr = (uchar *)local_40;
    uVar5 = local_4c;
    sVar3 = osrndsz(2);
    local_48->mcmosiz = uVar5 - (short)sVar3;
    puVar4 = (uchar *)((long)local_40 + (long)(int)(uint)local_4c);
    sVar3 = osrndsz(2);
    (puVar4 + -sVar3)[0] = 0xff;
    (puVar4 + -sVar3)[1] = 0xff;
    mcmadpg(local_38,0,2);
    return local_38;
  }
  local_30->errcxptr = in_stack_fffffffffffffe78;
  mcsclose((mcscxdef *)0x146c5e);
  free(local_40);
  errsigf(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,0);
}

Assistant:

mcmcx1def *mcmini(ulong max, uint pages, ulong swapsize,
                  osfildef *swapfp, char *swapfilename, errcxdef *errctx)
{
    mcmcx1def *ctx;                /* newly-allocated cache manager context */
    uchar     *noreg chunk;/* 1st chunk of memory managed by this cache mgr */
    mcmodef   *obj;                      /* pointer to a cache object entry */
    ushort     siz;                /* size of current thing being allocated */
    ushort     rem;                             /* bytes remaining in chunk */
    int        err;
    
    NOREG((&chunk))
    
    /* make sure 'max' is big enough - must be at least one chunk */
    if (max < (ulong)MCMCHUNK) max = (ulong)MCMCHUNK;
    
    /* allocate space for control structures from low-level heap */
    rem = MCMCHUNK;
    
    IF_DEBUG(rem += sizeof(long));
    chunk = mchalo(errctx, rem, "mcmini");
    IF_DEBUG((*(ulong *)chunk = 0x01010101, chunk += sizeof(ulong),
        rem -= sizeof(ulong)));
    
    ctx = (mcmcx1def *)chunk;              /* put context at start of chunk */
    
    /* initialize swapper; clean up if it fails */
    ERRBEGIN(errctx)
        mcsini(&ctx->mcmcxswc, ctx, swapsize, swapfp, swapfilename, errctx);
    ERRCATCH(errctx, err)
        mcsclose(&ctx->mcmcxswc);
        mchfre(chunk);
        errsig(errctx, err);
    ERREND(errctx)
    
    chunk += sizeof(mcmcx1def);           /* rest of chunk is after context */
    rem -= sizeof(mcmcx1def);         /* remove from remaining size counter */

    /* allocate the page table (an array of pointers to pages) */
    ctx->mcmcxtab = (mcmodef **)chunk;            /* put at bottom of chunk */
    siz = pages * sizeof(mcmodef *);              /* calcuate size of table */

    memset(ctx->mcmcxtab, 0, (size_t)siz);            /* clear entire table */
    chunk += siz;                                  /* reflect size of table */
    rem -= siz;                       /* take it out of the remaining count */

    /* here we begin normal heap marking with object references */
    ctx->mcmcxhpch = (mcmhdef *)chunk;           /* set start of heap chain */
    chunk += sizeof(mcmhdef);
    rem -= sizeof(mcmhdef);
    ctx->mcmcxhpch->mcmhnxt = (mcmhdef *)0;    /* no next heap in chain yet */
    
    /* allocate the first page */
    *(mcmon *)chunk = 0;               /* set object number header in chunk */
    chunk += osrndsz(sizeof(mcmon));
    rem -= osrndsz(sizeof(mcmon));

    ctx->mcmcxtab[0] = (mcmodef *)chunk;          /* put at bottom of chunk */
    memset(ctx->mcmcxtab[0], 0, (size_t)MCMPAGESIZE);
    chunk += MCMPAGESIZE;                           /* reflect size of page */
    rem -= MCMPAGESIZE;                     /* take it out of the remainder */
    
    /* set up the first page with an entry for itself */
    obj = mcmgobje(ctx, (mcmon)0);             /* point to first page entry */
    obj->mcmoflg = MCMOFPRES | MCMOFNODISC | MCMOFPAGE | MCMOFNOSWAP;
    obj->mcmoptr = (uchar *)ctx->mcmcxtab[0];
    obj->mcmosiz = MCMPAGESIZE;
    
    /* set up the rest of the context */
    ctx->mcmcxlru = ctx->mcmcxmru = MCMONINV;        /* no mru/lru list yet */
    ctx->mcmcxmax = max - (ulong)MCMCHUNK;
    ctx->mcmcxpage = 1;        /* next page slot to be allocated will be #1 */
    ctx->mcmcxpgmx = pages;          /* max number of pages we can allocate */
    ctx->mcmcxerr = errctx;
    ctx->mcmcxcsw = mcmcswf;
    
    /* set up the free list with the remainder of the chunk */
    ctx->mcmcxfre = 1;     /* we've allocated object 0; obj 1 is free space */
    obj = mcmgobje(ctx, ctx->mcmcxfre);       /* point to free object entry */
    obj->mcmonxt = obj->mcmoprv = MCMONINV;             /* end of free list */
    obj->mcmoflg = MCMOFFREE;                /* mark the free block as such */
    *(mcmon *)chunk = ctx->mcmcxfre;                /* set free list header */

    chunk += osrndsz(sizeof(mcmon));
    rem -= osrndsz(sizeof(mcmon));
    obj->mcmoptr = chunk;                                  /* rest of chunk */

    obj->mcmosiz = rem - osrndsz(sizeof(mcmon));          /* remaining size in chunk */

    /* set flag for end of chunk (invalid object header) */
    *((mcmon *)(chunk + rem - osrndsz(sizeof(mcmon)))) = MCMONINV;
    
    /* set up the unused entry list with the remaining headers in the page */
    mcmadpg(ctx, 0, 2);
    
    return(ctx);
}